

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_selection.cpp
# Opt level: O0

InstListIter
mocker::anon_unknown_0::genInst
          (Section *text,FuncSelectionContext *ctx,FunctionModule *func,const_iterator curBBIter,
          const_iterator bbIterEnd,InstListIter curInstIter)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  OpType OVar3;
  element_type *peVar4;
  size_t sVar5;
  element_type *peVar6;
  __shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var7;
  element_type *peVar8;
  size_t sVar9;
  reference psVar10;
  pointer pBVar11;
  element_type *peVar12;
  __shared_ptr *this;
  reference reg_00;
  shared_ptr<mocker::nasm::Register> *psVar13;
  element_type *peVar14;
  element_type *peVar15;
  shared_ptr<mocker::ir::Reg> *psVar16;
  size_t local_350;
  size_t local_330;
  bool local_281;
  OpType local_280 [2];
  undefined1 local_278 [32];
  undefined1 local_258 [16];
  undefined1 local_248 [8];
  shared_ptr<mocker::nasm::Register> dest;
  shared_ptr<mocker::ir::ArithUnaryInst> p_10;
  undefined1 local_218 [8];
  shared_ptr<mocker::ir::Malloc> p_9;
  shared_ptr<mocker::ir::Call> p_8;
  shared_ptr<mocker::nasm::Register> *reg;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  *__range3;
  shared_ptr<mocker::nasm::Addr> val;
  shared_ptr<mocker::ir::Ret> p_7;
  shared_ptr<mocker::ir::Branch> p_6;
  undefined1 local_1a0 [7];
  bool skip;
  shared_ptr<mocker::ir::RelationInst> p_5;
  InstListIter nextNextIter;
  shared_ptr<mocker::ir::ArithBinaryInst> add;
  shared_ptr<mocker::ir::IRInst> nextInst;
  shared_ptr<mocker::ir::ArithBinaryInst> p_4;
  shared_ptr<mocker::ir::Load> p_3;
  shared_ptr<mocker::ir::Store> p_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined1 local_f8 [16];
  undefined1 local_e8 [8];
  shared_ptr<mocker::ir::Jump> p_1;
  undefined1 local_d0 [32];
  undefined1 local_b0 [16];
  undefined1 local_a0 [8];
  shared_ptr<mocker::ir::Assign> p;
  shared_ptr<mocker::ir::AttachedComment> local_70;
  shared_ptr<mocker::ir::Comment> local_60;
  _List_const_iterator<mocker::ir::BasicBlock> local_50;
  const_iterator nextBBIter;
  shared_ptr<mocker::ir::IRInst> *inst;
  FunctionModule *func_local;
  FuncSelectionContext *ctx_local;
  Section *text_local;
  InstListIter curInstIter_local;
  const_iterator bbIterEnd_local;
  const_iterator curBBIter_local;
  InstListIter nextIter;
  
  text_local = (Section *)curInstIter._M_node;
  curInstIter_local._M_node = bbIterEnd._M_node;
  nextBBIter._M_node =
       (_List_node_base *)
       std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator*
                 ((_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_> *)&text_local);
  curBBIter_local._M_node = (_List_node_base *)text_local;
  std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator++
            ((_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_> *)&curBBIter_local);
  local_50._M_node = curBBIter._M_node;
  std::_List_const_iterator<mocker::ir::BasicBlock>::operator++(&local_50);
  ir::dyc<mocker::ir::Comment,std::shared_ptr<mocker::ir::IRInst>const&>
            ((ir *)&local_60,(shared_ptr<mocker::ir::IRInst> *)nextBBIter._M_node);
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_60);
  local_281 = true;
  if (!bVar2) {
    ir::dyc<mocker::ir::AttachedComment,std::shared_ptr<mocker::ir::IRInst>const&>
              ((ir *)&local_70,(shared_ptr<mocker::ir::IRInst> *)nextBBIter._M_node);
    local_281 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_70);
    std::shared_ptr<mocker::ir::AttachedComment>::~shared_ptr(&local_70);
  }
  std::shared_ptr<mocker::ir::Comment>::~shared_ptr(&local_60);
  if (local_281 != false) {
    return (InstListIter)curBBIter_local._M_node;
  }
  ir::dyc<mocker::ir::Phi,std::shared_ptr<mocker::ir::IRInst>const&>
            ((ir *)&p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,(shared_ptr<mocker::ir::IRInst> *)nextBBIter._M_node);
  bVar2 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr *)
                     &p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
  std::shared_ptr<mocker::ir::Phi>::~shared_ptr
            ((shared_ptr<mocker::ir::Phi> *)
             &p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (bVar2) {
    return (InstListIter)curBBIter_local._M_node;
  }
  ir::dyc<mocker::ir::Assign,std::shared_ptr<mocker::ir::IRInst>const&>
            ((ir *)local_a0,(shared_ptr<mocker::ir::IRInst> *)nextBBIter._M_node);
  p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_1_ =
       std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_a0);
  if (p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_1_)
  {
    peVar4 = std::__shared_ptr_access<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_a0);
    psVar16 = ir::Definition::getDest(&peVar4->super_Definition);
    std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>
              ((shared_ptr<mocker::ir::Addr> *)(local_d0 + 0x10),psVar16);
    FuncSelectionContext::getIrAddr
              ((FuncSelectionContext *)local_b0,(shared_ptr<mocker::ir::Addr> *)ctx);
    peVar4 = std::__shared_ptr_access<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_a0);
    ir::Assign::getOperand(peVar4);
    FuncSelectionContext::getIrAddr
              ((FuncSelectionContext *)local_d0,(shared_ptr<mocker::ir::Addr> *)ctx);
    nasm::Section::
    emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Addr>,std::shared_ptr<mocker::nasm::Addr>>
              (text,(shared_ptr<mocker::nasm::Addr> *)local_b0,
               (shared_ptr<mocker::nasm::Addr> *)local_d0);
    std::shared_ptr<mocker::nasm::Addr>::~shared_ptr((shared_ptr<mocker::nasm::Addr> *)local_d0);
    std::shared_ptr<mocker::nasm::Addr>::~shared_ptr((shared_ptr<mocker::nasm::Addr> *)local_b0);
    std::shared_ptr<mocker::ir::Addr>::~shared_ptr
              ((shared_ptr<mocker::ir::Addr> *)(local_d0 + 0x10));
  }
  p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._5_3_ = 0;
  std::shared_ptr<mocker::ir::Assign>::~shared_ptr((shared_ptr<mocker::ir::Assign> *)local_a0);
  if (p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
      != 0) {
    return (InstListIter)curBBIter_local._M_node;
  }
  ir::dyc<mocker::ir::Jump,std::shared_ptr<mocker::ir::IRInst>const&>
            ((ir *)local_e8,(shared_ptr<mocker::ir::IRInst> *)nextBBIter._M_node);
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_e8);
  if (!bVar2) {
    p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 0
    ;
    goto LAB_0012c423;
  }
  bVar2 = std::operator==(&local_50,(_Self *)&curInstIter_local);
  if (bVar2) {
LAB_0012c2d7:
    peVar6 = std::__shared_ptr_access<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_e8);
    p_Var7 = (__shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             ir::Jump::getLabel(peVar6);
    peVar8 = std::__shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(p_Var7);
    sVar5 = ir::Label::getID(peVar8);
    std::__cxx11::to_string
              ((string *)
               &p_2.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               sVar5);
    std::operator+(&local_118,".L",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &p_2.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
    std::make_shared<mocker::nasm::Label,std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    nasm::Section::emplaceInst<mocker::nasm::Jmp,std::shared_ptr<mocker::nasm::Label>>
              (text,(shared_ptr<mocker::nasm::Label> *)local_f8);
    std::shared_ptr<mocker::nasm::Label>::~shared_ptr((shared_ptr<mocker::nasm::Label> *)local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string
              ((string *)
               &p_2.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  else {
    pBVar11 = std::_List_const_iterator<mocker::ir::BasicBlock>::operator->(&local_50);
    sVar5 = ir::BasicBlock::getLabelID(pBVar11);
    peVar6 = std::__shared_ptr_access<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_e8);
    p_Var7 = (__shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             ir::Jump::getLabel(peVar6);
    peVar8 = std::__shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(p_Var7);
    sVar9 = ir::Label::getID(peVar8);
    if (sVar5 != sVar9) goto LAB_0012c2d7;
  }
  p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 1;
LAB_0012c423:
  std::shared_ptr<mocker::ir::Jump>::~shared_ptr((shared_ptr<mocker::ir::Jump> *)local_e8);
  if (p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
      == 0) {
    ir::dyc<mocker::ir::Store,std::shared_ptr<mocker::ir::IRInst>const&>
              ((ir *)&p_3.super___shared_ptr<mocker::ir::Load,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(shared_ptr<mocker::ir::IRInst> *)nextBBIter._M_node);
    bVar2 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr *)
                       &p_3.super___shared_ptr<mocker::ir::Load,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
    if (bVar2) {
      genStore(text,ctx,(shared_ptr<mocker::ir::Store> *)
                        &p_3.super___shared_ptr<mocker::ir::Load,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
    }
    p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._5_3_ = 0
    ;
    p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_1_ =
         bVar2;
    std::shared_ptr<mocker::ir::Store>::~shared_ptr
              ((shared_ptr<mocker::ir::Store> *)
               &p_3.super___shared_ptr<mocker::ir::Load,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
        == 0) {
      ir::dyc<mocker::ir::Load,std::shared_ptr<mocker::ir::IRInst>const&>
                ((ir *)&p_4.
                        super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,(shared_ptr<mocker::ir::IRInst> *)nextBBIter._M_node);
      bVar2 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr *)
                         &p_4.
                          super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
      if (bVar2) {
        genLoad(text,ctx,(shared_ptr<mocker::ir::Load> *)
                         &p_4.
                          super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
      }
      p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._5_3_ =
           0;
      p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_1_ =
           bVar2;
      std::shared_ptr<mocker::ir::Load>::~shared_ptr
                ((shared_ptr<mocker::ir::Load> *)
                 &p_4.super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      if (p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_4_ == 0) {
        ir::dyc<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::IRInst>const&>
                  ((ir *)&nextInst.
                          super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,(shared_ptr<mocker::ir::IRInst> *)nextBBIter._M_node);
        bVar2 = std::__shared_ptr::operator_cast_to_bool
                          ((__shared_ptr *)
                           &nextInst.
                            super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
        if (bVar2) {
          psVar10 = std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator*
                              ((_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_> *)
                               &curBBIter_local);
          p_Var1 = &add.super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount;
          std::shared_ptr<mocker::ir::IRInst>::shared_ptr
                    ((shared_ptr<mocker::ir::IRInst> *)p_Var1,psVar10);
          ir::dyc<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::IRInst>&>
                    ((ir *)&nextNextIter,(shared_ptr<mocker::ir::IRInst> *)p_Var1);
          bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&nextNextIter);
          if (bVar2) {
            p_5.super___shared_ptr<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)curBBIter_local._M_node;
            p_Var1 = &p_5.super___shared_ptr<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
            std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator++
                      ((_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_> *)p_Var1);
            psVar10 = std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator*
                                ((_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_> *)
                                 p_Var1);
            bVar2 = tryCombineMemInst(text,ctx,(shared_ptr<mocker::ir::ArithBinaryInst> *)
                                               &nextInst.
                                                super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount,
                                      (shared_ptr<mocker::ir::ArithBinaryInst> *)&nextNextIter,
                                      psVar10);
            if (bVar2) {
              std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator++
                        ((_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_> *)
                         &curBBIter_local);
              std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator++
                        ((_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_> *)
                         &curBBIter_local);
            }
            else {
              genArithBinary(text,ctx,(shared_ptr<mocker::ir::ArithBinaryInst> *)
                                      &nextInst.
                                       super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount);
            }
          }
          else {
            genArithBinary(text,ctx,(shared_ptr<mocker::ir::ArithBinaryInst> *)
                                    &nextInst.
                                     super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount);
          }
          p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_4_ = 1;
          std::shared_ptr<mocker::ir::ArithBinaryInst>::~shared_ptr
                    ((shared_ptr<mocker::ir::ArithBinaryInst> *)&nextNextIter);
          std::shared_ptr<mocker::ir::IRInst>::~shared_ptr
                    ((shared_ptr<mocker::ir::IRInst> *)
                     &add.
                      super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        else {
          p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_4_ = 0;
        }
        std::shared_ptr<mocker::ir::ArithBinaryInst>::~shared_ptr
                  ((shared_ptr<mocker::ir::ArithBinaryInst> *)
                   &nextInst.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        if (p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
            _4_4_ == 0) {
          ir::dyc<mocker::ir::RelationInst,std::shared_ptr<mocker::ir::IRInst>const&>
                    ((ir *)local_1a0,(shared_ptr<mocker::ir::IRInst> *)nextBBIter._M_node);
          bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_1a0);
          if (bVar2) {
            psVar10 = std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator*
                                ((_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_> *)
                                 &curBBIter_local);
            bVar2 = std::operator==(&local_50,(_Self *)&curInstIter_local);
            if (bVar2) {
              local_330 = 0xffffffffffffffff;
            }
            else {
              pBVar11 = std::_List_const_iterator<mocker::ir::BasicBlock>::operator->(&local_50);
              local_330 = ir::BasicBlock::getLabelID(pBVar11);
            }
            bVar2 = genRelation(text,ctx,(shared_ptr<mocker::ir::RelationInst> *)local_1a0,psVar10,
                                local_330);
            if (bVar2) {
              std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator++
                        ((_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_> *)
                         &curBBIter_local);
            }
            p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
            _4_4_ = 1;
          }
          else {
            p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
            _4_4_ = 0;
          }
          std::shared_ptr<mocker::ir::RelationInst>::~shared_ptr
                    ((shared_ptr<mocker::ir::RelationInst> *)local_1a0);
          if (p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              ._4_4_ == 0) {
            ir::dyc<mocker::ir::Branch,std::shared_ptr<mocker::ir::IRInst>const&>
                      ((ir *)&p_7.super___shared_ptr<mocker::ir::Ret,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount,(shared_ptr<mocker::ir::IRInst> *)nextBBIter._M_node);
            bVar2 = std::__shared_ptr::operator_cast_to_bool
                              ((__shared_ptr *)
                               &p_7.super___shared_ptr<mocker::ir::Ret,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
            if (bVar2) {
              bVar2 = std::operator==(&local_50,(_Self *)&curInstIter_local);
              if (bVar2) {
                local_350 = 0xffffffffffffffff;
              }
              else {
                pBVar11 = std::_List_const_iterator<mocker::ir::BasicBlock>::operator->(&local_50);
                local_350 = ir::BasicBlock::getLabelID(pBVar11);
              }
              genBranch(text,ctx,(shared_ptr<mocker::ir::Branch> *)
                                 &p_7.
                                  super___shared_ptr<mocker::ir::Ret,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount,local_350);
              p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              ._4_4_ = 1;
            }
            else {
              p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              ._4_4_ = 0;
            }
            std::shared_ptr<mocker::ir::Branch>::~shared_ptr
                      ((shared_ptr<mocker::ir::Branch> *)
                       &p_7.super___shared_ptr<mocker::ir::Ret,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            if (p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi._4_4_ == 0) {
              ir::dyc<mocker::ir::Ret,std::shared_ptr<mocker::ir::IRInst>const&>
                        ((ir *)&val.
                                super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount,(shared_ptr<mocker::ir::IRInst> *)nextBBIter._M_node);
              bVar2 = std::__shared_ptr::operator_cast_to_bool
                                ((__shared_ptr *)
                                 &val.
                                  super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
              if (bVar2) {
                peVar12 = std::
                          __shared_ptr_access<mocker::ir::Ret,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<mocker::ir::Ret,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)&val.
                                           super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount);
                this = (__shared_ptr *)ir::Ret::getVal(peVar12);
                bVar2 = std::__shared_ptr::operator_cast_to_bool(this);
                if (bVar2) {
                  peVar12 = std::
                            __shared_ptr_access<mocker::ir::Ret,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<mocker::ir::Ret,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)&val.
                                             super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_refcount);
                  ir::Ret::getVal(peVar12);
                  FuncSelectionContext::getIrAddr
                            ((FuncSelectionContext *)&__range3,(shared_ptr<mocker::ir::Addr> *)ctx);
                  psVar13 = nasm::rax();
                  nasm::Section::
                  emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::Addr>&>
                            (text,psVar13,(shared_ptr<mocker::nasm::Addr> *)&__range3);
                  std::shared_ptr<mocker::nasm::Addr>::~shared_ptr
                            ((shared_ptr<mocker::nasm::Addr> *)&__range3);
                }
                __end3 = std::
                         vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                         ::begin((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                  *)(anonymous_namespace)::CalleeSave);
                reg = (shared_ptr<mocker::nasm::Register> *)
                      std::
                      vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ::end((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                             *)(anonymous_namespace)::CalleeSave);
                while (bVar2 = __gnu_cxx::operator!=
                                         (&__end3,(
                                                  __normal_iterator<const_std::shared_ptr<mocker::nasm::Register>_*,_std::vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>
                                                  *)&reg), bVar2) {
                  reg_00 = __gnu_cxx::
                           __normal_iterator<const_std::shared_ptr<mocker::nasm::Register>_*,_std::vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>
                           ::operator*(&__end3);
                  psVar13 = FuncSelectionContext::getPRegAddr(ctx,reg_00);
                  nasm::Section::
                  emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::Register>const&>
                            (text,reg_00,psVar13);
                  __gnu_cxx::
                  __normal_iterator<const_std::shared_ptr<mocker::nasm::Register>_*,_std::vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>
                  ::operator++(&__end3);
                }
                nasm::Section::emplaceInst<mocker::nasm::Leave>(text);
                nasm::Section::emplaceInst<mocker::nasm::Ret>(text);
                p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi._4_4_ = 1;
              }
              else {
                p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi._4_4_ = 0;
              }
              std::shared_ptr<mocker::ir::Ret>::~shared_ptr
                        ((shared_ptr<mocker::ir::Ret> *)
                         &val.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              if (p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi._4_4_ == 0) {
                ir::dyc<mocker::ir::Call,std::shared_ptr<mocker::ir::IRInst>const&>
                          ((ir *)&p_9.
                                  super___shared_ptr<mocker::ir::Malloc,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount,(shared_ptr<mocker::ir::IRInst> *)nextBBIter._M_node)
                ;
                bVar2 = std::__shared_ptr::operator_cast_to_bool
                                  ((__shared_ptr *)
                                   &p_9.
                                    super___shared_ptr<mocker::ir::Malloc,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
                if (bVar2) {
                  genCall(text,ctx,(shared_ptr<mocker::ir::Call> *)
                                   &p_9.
                                    super___shared_ptr<mocker::ir::Malloc,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
                }
                p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi._5_3_ = 0;
                p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi._4_1_ = bVar2;
                std::shared_ptr<mocker::ir::Call>::~shared_ptr
                          ((shared_ptr<mocker::ir::Call> *)
                           &p_9.super___shared_ptr<mocker::ir::Malloc,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                if (p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    ._M_pi._4_4_ == 0) {
                  ir::dyc<mocker::ir::Malloc,std::shared_ptr<mocker::ir::IRInst>const&>
                            ((ir *)local_218,(shared_ptr<mocker::ir::IRInst> *)nextBBIter._M_node);
                  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_218);
                  if (bVar2) {
                    peVar14 = std::
                              __shared_ptr_access<mocker::ir::Malloc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->((__shared_ptr_access<mocker::ir::Malloc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            *)local_218);
                    psVar16 = ir::Definition::getDest(&peVar14->super_Definition);
                    peVar14 = std::
                              __shared_ptr_access<mocker::ir::Malloc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->((__shared_ptr_access<mocker::ir::Malloc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            *)local_218);
                    ir::Malloc::getSize(peVar14);
                    std::
                    make_shared<mocker::ir::Call,std::shared_ptr<mocker::ir::Reg>const&,char_const(&)[8],std::shared_ptr<mocker::ir::Addr>const&>
                              ((shared_ptr<mocker::ir::Reg> *)
                               &p_10.
                                super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount,(char (*) [8])psVar16,
                               (shared_ptr<mocker::ir::Addr> *)"__alloc");
                    genCall(text,ctx,(shared_ptr<mocker::ir::Call> *)
                                     &p_10.
                                      super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount);
                    std::shared_ptr<mocker::ir::Call>::~shared_ptr
                              ((shared_ptr<mocker::ir::Call> *)
                               &p_10.
                                super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
                  }
                  p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi._5_3_ = 0;
                  p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi._4_1_ = bVar2;
                  std::shared_ptr<mocker::ir::Malloc>::~shared_ptr
                            ((shared_ptr<mocker::ir::Malloc> *)local_218);
                  if (p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi._4_4_ == 0) {
                    ir::dyc<mocker::ir::ArithUnaryInst,std::shared_ptr<mocker::ir::IRInst>const&>
                              ((ir *)&dest.
                                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount,
                               (shared_ptr<mocker::ir::IRInst> *)nextBBIter._M_node);
                    bVar2 = std::__shared_ptr::operator_cast_to_bool
                                      ((__shared_ptr *)
                                       &dest.
                                        super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
                    if (bVar2) {
                      peVar15 = std::
                                __shared_ptr_access<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)&dest.
                                                 super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_refcount);
                      psVar16 = ir::Definition::getDest(&peVar15->super_Definition);
                      std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>
                                ((shared_ptr<mocker::ir::Addr> *)(local_278 + 0x10),psVar16);
                      FuncSelectionContext::getIrAddr
                                ((FuncSelectionContext *)local_258,
                                 (shared_ptr<mocker::ir::Addr> *)ctx);
                      nasm::dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>>
                                ((shared_ptr<mocker::nasm::Addr> *)local_248);
                      std::shared_ptr<mocker::nasm::Addr>::~shared_ptr
                                ((shared_ptr<mocker::nasm::Addr> *)local_258);
                      std::shared_ptr<mocker::ir::Addr>::~shared_ptr
                                ((shared_ptr<mocker::ir::Addr> *)(local_278 + 0x10));
                      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_248);
                      if (!bVar2) {
                        __assert_fail("dest",
                                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/instruction_selection.cpp"
                                      ,0x1df,
                                      "ir::InstListIter mocker::(anonymous namespace)::genInst(nasm::Section &, FuncSelectionContext &, const ir::FunctionModule &, ir::BasicBlockList::const_iterator, ir::BasicBlockList::const_iterator, ir::InstListIter)"
                                     );
                      }
                      peVar15 = std::
                                __shared_ptr_access<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)&dest.
                                                 super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_refcount);
                      ir::ArithUnaryInst::getOperand(peVar15);
                      FuncSelectionContext::getIrAddr
                                ((FuncSelectionContext *)local_278,
                                 (shared_ptr<mocker::ir::Addr> *)ctx);
                      nasm::Section::
                      emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::Addr>>
                                (text,(shared_ptr<mocker::nasm::Register> *)local_248,
                                 (shared_ptr<mocker::nasm::Addr> *)local_278);
                      std::shared_ptr<mocker::nasm::Addr>::~shared_ptr
                                ((shared_ptr<mocker::nasm::Addr> *)local_278);
                      peVar15 = std::
                                __shared_ptr_access<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)&dest.
                                                 super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_refcount);
                      OVar3 = ir::ArithUnaryInst::getOp(peVar15);
                      if (OVar3 == Neg) {
                        local_280[1] = 0;
                        nasm::Section::
                        emplaceInst<mocker::nasm::UnaryInst,mocker::nasm::UnaryInst::OpType,std::shared_ptr<mocker::nasm::Register>&>
                                  (text,local_280 + 1,
                                   (shared_ptr<mocker::nasm::Register> *)local_248);
                      }
                      else {
                        local_280[0] = Not;
                        nasm::Section::
                        emplaceInst<mocker::nasm::UnaryInst,mocker::nasm::UnaryInst::OpType,std::shared_ptr<mocker::nasm::Register>&>
                                  (text,local_280,(shared_ptr<mocker::nasm::Register> *)local_248);
                      }
                      p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi._4_4_ = 1;
                      std::shared_ptr<mocker::nasm::Register>::~shared_ptr
                                ((shared_ptr<mocker::nasm::Register> *)local_248);
                    }
                    else {
                      p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi._4_4_ = 0;
                    }
                    std::shared_ptr<mocker::ir::ArithUnaryInst>::~shared_ptr
                              ((shared_ptr<mocker::ir::ArithUnaryInst> *)
                               &dest.
                                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
                    if (p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_ == 0) {
                      __assert_fail("false",
                                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/instruction_selection.cpp"
                                    ,0x1e7,
                                    "ir::InstListIter mocker::(anonymous namespace)::genInst(nasm::Section &, FuncSelectionContext &, const ir::FunctionModule &, ir::BasicBlockList::const_iterator, ir::BasicBlockList::const_iterator, ir::InstListIter)"
                                   );
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (InstListIter)curBBIter_local._M_node;
}

Assistant:

ir::InstListIter genInst(nasm::Section &text, FuncSelectionContext &ctx,
                         const ir::FunctionModule &func,
                         ir::BasicBlockList::const_iterator curBBIter,
                         ir::BasicBlockList::const_iterator bbIterEnd,
                         ir::InstListIter curInstIter) {
  auto &inst = *curInstIter;
  auto nextIter = curInstIter;
  ++nextIter;
  auto nextBBIter = curBBIter;
  ++nextBBIter;

  if (ir::dyc<ir::Comment>(inst) || ir::dyc<ir::AttachedComment>(inst))
    return nextIter;

  if (ir::dyc<ir::Phi>(inst))
    return nextIter;

  if (auto p = ir::dyc<ir::Assign>(inst)) {
    text.emplaceInst<nasm::Mov>(ctx.getIrAddr(p->getDest()),
                                ctx.getIrAddr(p->getOperand()));
    return nextIter;
  }

  if (auto p = ir::dyc<ir::Jump>(inst)) {
    if (nextBBIter == bbIterEnd ||
        nextBBIter->getLabelID() != p->getLabel()->getID())
      text.emplaceInst<nasm::Jmp>(std::make_shared<nasm::Label>(
          ".L" + std::to_string(p->getLabel()->getID())));
    return nextIter;
  }

  if (auto p = ir::dyc<ir::Store>(inst)) {
    genStore(text, ctx, p);
    return nextIter;
  }
  if (auto p = ir::dyc<ir::Load>(inst)) {
    genLoad(text, ctx, p);
    return nextIter;
  }

  if (auto p = ir::dyc<ir::ArithBinaryInst>(inst)) {
    auto nextInst = *nextIter;
    auto add = ir::dyc<ir::ArithBinaryInst>(nextInst);
    if (!add) {
      genArithBinary(text, ctx, p);
      return nextIter;
    }
    auto nextNextIter = nextIter;
    ++nextNextIter;
    if (tryCombineMemInst(text, ctx, p, add, *nextNextIter)) {
      ++nextIter;
      ++nextIter;
    } else {
      genArithBinary(text, ctx, p);
    }
    return nextIter;
  }

  if (auto p = ir::dyc<ir::RelationInst>(inst)) {
    auto skip =
        genRelation(text, ctx, p, *nextIter,
                    nextBBIter == bbIterEnd ? -1 : nextBBIter->getLabelID());
    if (skip)
      ++nextIter;
    return nextIter;
  }

  if (auto p = ir::dyc<ir::Branch>(inst)) {
    genBranch(text, ctx, p,
              nextBBIter == bbIterEnd ? -1 : nextBBIter->getLabelID());
    return nextIter;
  }

  if (auto p = ir::dyc<ir::Ret>(inst)) {
    if (p->getVal()) {
      auto val = ctx.getIrAddr(p->getVal());
      text.emplaceInst<nasm::Mov>(nasm::rax(), val);
    }
    for (auto &reg : CalleeSave) {
      text.emplaceInst<nasm::Mov>(reg, ctx.getPRegAddr(reg));
    }
    text.emplaceInst<nasm::Leave>();
    text.emplaceInst<nasm::Ret>();
    return nextIter;
  }

  if (auto p = ir::dyc<ir::Call>(inst)) {
    genCall(text, ctx, p);
    return nextIter;
  }
  if (auto p = ir::dyc<ir::Malloc>(inst)) {
    genCall(text, ctx,
            std::make_shared<ir::Call>(p->getDest(), "__alloc", p->getSize()));
    return nextIter;
  }

  if (auto p = ir::dyc<ir::ArithUnaryInst>(inst)) {
    auto dest = nasm::dyc<nasm::Register>(ctx.getIrAddr(p->getDest()));
    assert(dest);
    text.emplaceInst<nasm::Mov>(dest, ctx.getIrAddr(p->getOperand()));
    if (p->getOp() == ir::ArithUnaryInst::Neg)
      text.emplaceInst<nasm::UnaryInst>(nasm::UnaryInst::Neg, dest);
    else
      text.emplaceInst<nasm::UnaryInst>(nasm::UnaryInst::Not, dest);
    return nextIter;
  }
  assert(false);
}